

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O3

void __thiscall chrono::ChLinkMarkers::UpdateRelMarkerCoords(ChLinkMarkers *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ChMarker *pCVar75;
  ChMarker *pCVar76;
  ChFrameMoving<double> *pCVar77;
  ChBodyFrame *pCVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  bool bVar83;
  ChQuaternion<double> *pCVar84;
  ChQuaternion<double> *pCVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  double dVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  double dVar130;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  double dVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  ChMatrix33<double> m2_Rel_A_dt;
  ChMatrix33<double> res;
  ChMatrix33<double> m2_Rel_A_dtdt;
  ChMatrix33<double> local_2a8;
  ChQuaternion<double> local_260;
  ChQuaternion<double> local_240;
  ChQuaternion<double> *local_220;
  ChQuaternion<double> local_218;
  ChQuaternion<double> local_1f8;
  ChQuaternion<double> local_1d8;
  ChMatrix33<double> local_1b8;
  double local_170;
  ChQuaternion<double> *local_168;
  ChQuaternion<double> *local_160;
  ChQuaternion<double> local_158;
  ChQuaternion<double> local_138;
  undefined1 local_118 [64];
  double local_d8;
  undefined1 local_c8 [24];
  ChQuaternion<double> local_b0;
  ChQuaternion<double> local_90;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  pCVar75 = this->marker1;
  pCVar76 = this->marker2;
  dVar106 = (pCVar75->abs_frame).super_ChFrame<double>.coord.pos.m_data[2] -
            (pCVar76->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  auVar86 = vsubpd_avx(*(undefined1 (*) [16])
                        (pCVar75->abs_frame).super_ChFrame<double>.coord.pos.m_data,
                       *(undefined1 (*) [16])
                        (pCVar76->abs_frame).super_ChFrame<double>.coord.pos.m_data);
  *(undefined1 (*) [16])(this->PQw).m_data = auVar86;
  (this->PQw).m_data[2] = dVar106;
  dVar130 = (pCVar75->abs_frame).coord_dt.pos.m_data[2] -
            (pCVar76->abs_frame).coord_dt.pos.m_data[2];
  auVar131 = vsubpd_avx(*(undefined1 (*) [16])(pCVar75->abs_frame).coord_dt.pos.m_data,
                        *(undefined1 (*) [16])(pCVar76->abs_frame).coord_dt.pos.m_data);
  *(undefined1 (*) [16])(this->PQw_dt).m_data = auVar131;
  (this->PQw_dt).m_data[2] = dVar130;
  auVar127._0_8_ = (pCVar75->abs_frame).coord_dtdt.pos.m_data[2];
  auVar103._0_8_ = (pCVar76->abs_frame).coord_dtdt.pos.m_data[2];
  auVar175 = vsubpd_avx(*(undefined1 (*) [16])(pCVar75->abs_frame).coord_dtdt.pos.m_data,
                        *(undefined1 (*) [16])(pCVar76->abs_frame).coord_dtdt.pos.m_data);
  *(undefined1 (*) [16])(this->PQw_dtdt).m_data = auVar175;
  (this->PQw_dtdt).m_data[2] = auVar127._0_8_ - auVar103._0_8_;
  auVar175 = vshufpd_avx(auVar86,auVar86,1);
  auVar127._0_8_ = auVar175._0_8_;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = auVar127._0_8_ * auVar127._0_8_;
  auVar175 = vfmadd231sd_fma(auVar175,auVar86,auVar86);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar106;
  auVar175 = vfmadd231sd_fma(auVar175,auVar88,auVar88);
  auVar175 = vsqrtsd_avx(auVar175,auVar175);
  auVar103._0_8_ = auVar175._0_8_;
  this->dist = auVar103._0_8_;
  bVar83 = 2.2250738585072014e-308 <= auVar103._0_8_;
  auVar103._0_8_ = 1.0 / auVar103._0_8_;
  auVar86._0_8_ =
       (ulong)bVar83 * (long)(auVar86._0_8_ * auVar103._0_8_) + (ulong)!bVar83 * 0x3ff0000000000000;
  auVar86._8_8_ = 0x3ff0000000000000;
  auVar175 = vshufpd_avx(auVar131,auVar131,1);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = (ulong)bVar83 * (long)(dVar106 * auVar103._0_8_);
  auVar107._8_8_ = 0;
  auVar107._0_8_ =
       auVar175._0_8_ * (double)((ulong)bVar83 * (long)(auVar127._0_8_ * auVar103._0_8_));
  auVar175 = vfmadd231sd_fma(auVar107,auVar131,auVar86);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = dVar130;
  auVar175 = vfmadd231sd_fma(auVar175,auVar131,auVar87);
  this->dist_dt = auVar175._0_8_;
  local_1d8.m_data[0] = 0.0;
  local_1d8.m_data[1] = 0.0;
  local_1d8.m_data[2] = 0.0;
  local_1d8.m_data[3] = 0.0;
  local_1f8.m_data[0] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
  local_1f8.m_data[1] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
  local_1f8.m_data[2] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
  local_1f8.m_data[3] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  local_218.m_data[0] = (pCVar76->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
  local_218.m_data[1] = (pCVar76->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
  local_218.m_data[2] = (pCVar76->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
  local_218.m_data[3] = (pCVar76->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  bVar83 = Qnotnull(&local_1f8);
  if ((bVar83) || (bVar83 = Qnotnull(&local_218), bVar83)) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
    Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
                super_ChFrame<double>.coord.rot);
    Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
            super_ChFrame<double>.coord.rot,
           &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qcross(&local_260,&local_138);
    Qcross((ChQuaternion<double> *)&local_1b8,&local_240);
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
                super_ChFrame<double>.coord.rot);
    Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
            super_ChFrame<double>.coord.rot,
           &(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&local_90,&local_b0);
    Qcross(&local_50,&local_70);
    Qadd((ChQuaternion<double> *)local_118,&local_158);
    auVar127._0_8_ =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar103._0_8_ =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    dVar106 = local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
    ;
    dVar130 = local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
    ;
    if (&local_2a8 != (ChMatrix33<double> *)&this->q_AD) goto LAB_0057e601;
  }
  else {
    auVar127._0_8_ = QNULL;
    auVar103._0_8_ = DAT_00b68838;
    dVar106 = DAT_00b68840;
    dVar130 = DAT_00b68848;
    if (this != (ChLinkMarkers *)(sBulletDNAstr64 + 0x3468)) {
LAB_0057e601:
      (this->q_AD).m_data[0] = auVar127._0_8_;
      (this->q_AD).m_data[1] = auVar103._0_8_;
      (this->q_AD).m_data[2] = dVar106;
      (this->q_AD).m_data[3] = dVar130;
    }
  }
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot);
  Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>
          .coord.rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_260,&local_138);
  Qcross((ChQuaternion<double> *)&local_1b8,&local_240);
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
              super_ChFrame<double>.coord.rot);
  Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot,
         &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_90,&local_b0);
  Qcross(&local_50,&local_70);
  Qadd((ChQuaternion<double> *)local_118,&local_158);
  local_160 = &this->q_BC;
  if (&local_2a8 != (ChMatrix33<double> *)local_160) {
    local_160->m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->q_BC).m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->q_BC).m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->q_BC).m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  pCVar75 = this->marker2;
  pCVar85 = &(pCVar75->super_ChFrameMoving<double>).coord_dtdt.rot;
  if (pCVar85 != &local_218) {
    local_218.m_data[0] = pCVar85->m_data[0];
    local_218.m_data[1] = (pCVar75->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[1];
    local_218.m_data[2] = (pCVar75->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[2];
    local_218.m_data[3] = (pCVar75->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[3];
  }
  bVar83 = Qnotnull(&local_218);
  if (bVar83) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dtdt.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qcross(&local_240,&local_260);
    Qcross((ChQuaternion<double> *)local_118,(ChQuaternion<double> *)&local_1b8);
    auVar127._0_8_ =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar103._0_8_ =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    dVar106 = local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
    ;
    dVar130 = local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
    ;
    if (&local_2a8 == (ChMatrix33<double> *)&this->q_8) goto LAB_0057e840;
  }
  else {
    auVar127._0_8_ = QNULL;
    auVar103._0_8_ = DAT_00b68838;
    dVar106 = DAT_00b68840;
    dVar130 = DAT_00b68848;
    if (this == (ChLinkMarkers *)(sBulletDNAstr64 + 0x3428)) goto LAB_0057e840;
  }
  (this->q_8).m_data[0] = auVar127._0_8_;
  (this->q_8).m_data[1] = auVar103._0_8_;
  (this->q_8).m_data[2] = dVar106;
  (this->q_8).m_data[3] = dVar130;
LAB_0057e840:
  pCVar75 = this->marker1;
  pCVar85 = &(pCVar75->super_ChFrameMoving<double>).coord_dtdt.rot;
  if (pCVar85 != &local_1f8) {
    local_1f8.m_data[0] = pCVar85->m_data[0];
    local_1f8.m_data[1] = (pCVar75->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[1];
    local_1f8.m_data[2] = (pCVar75->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[2];
    local_1f8.m_data[3] = (pCVar75->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[3];
  }
  bVar83 = Qnotnull(&local_1f8);
  if (bVar83) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).coord_dtdt.rot);
    Qcross(&local_240,&local_260);
    Qcross((ChQuaternion<double> *)local_118,(ChQuaternion<double> *)&local_1b8);
    pCVar85 = &this->q_8;
    local_1d8.m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1d8.m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(pCVar85,&local_1d8);
    if (&local_2a8 != (ChMatrix33<double> *)pCVar85) {
      pCVar85->m_data[0] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      (this->q_8).m_data[1] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      (this->q_8).m_data[2] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      (this->q_8).m_data[3] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  pCVar75 = this->marker2;
  pCVar85 = &(pCVar75->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar85 != &local_218) {
    local_218.m_data[0] = pCVar85->m_data[0];
    local_218.m_data[1] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_218.m_data[2] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_218.m_data[3] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar83 = Qnotnull(&local_218);
  if (bVar83) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qcross(&local_240,&local_260);
    Qcross((ChQuaternion<double> *)local_118,(ChQuaternion<double> *)&local_1b8);
    local_1d8.m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1d8.m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_2a8,&local_1d8,2.0);
    pCVar85 = &this->q_8;
    local_1d8.m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1d8.m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(pCVar85,&local_1d8);
    if (&local_2a8 != (ChMatrix33<double> *)pCVar85) {
      pCVar85->m_data[0] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      (this->q_8).m_data[1] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      (this->q_8).m_data[2] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      (this->q_8).m_data[3] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  pCVar75 = this->marker2;
  pCVar85 = &(pCVar75->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar85 != &local_218) {
    local_218.m_data[0] = pCVar85->m_data[0];
    local_218.m_data[1] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_218.m_data[2] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_218.m_data[3] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar83 = Qnotnull(&local_218);
  if (bVar83) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dt.rot,
           &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qcross(&local_240,&local_260);
    Qcross((ChQuaternion<double> *)local_118,(ChQuaternion<double> *)&local_1b8);
    local_1d8.m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1d8.m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_2a8,&local_1d8,2.0);
    pCVar85 = &this->q_8;
    local_1d8.m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1d8.m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(pCVar85,&local_1d8);
    if (&local_2a8 != (ChMatrix33<double> *)pCVar85) {
      pCVar85->m_data[0] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      (this->q_8).m_data[1] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      (this->q_8).m_data[2] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      (this->q_8).m_data[3] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  pCVar75 = this->marker1;
  pCVar85 = &(pCVar75->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar85 != &local_1f8) {
    local_1f8.m_data[0] = pCVar85->m_data[0];
    local_1f8.m_data[1] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_1f8.m_data[2] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_1f8.m_data[3] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  pCVar75 = this->marker2;
  pCVar85 = &(pCVar75->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar85 != &local_218) {
    local_218.m_data[0] = pCVar85->m_data[0];
    local_218.m_data[1] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_218.m_data[2] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_218.m_data[3] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar83 = Qnotnull(&local_218);
  if ((bVar83) && (bVar83 = Qnotnull(&local_1f8), bVar83)) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&local_240,&local_260);
    Qcross((ChQuaternion<double> *)local_118,(ChQuaternion<double> *)&local_1b8);
    local_1d8.m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1d8.m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_2a8,&local_1d8,2.0);
    pCVar85 = &this->q_8;
    local_1d8.m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1d8.m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(pCVar85,&local_1d8);
    if (&local_2a8 != (ChMatrix33<double> *)pCVar85) {
      pCVar85->m_data[0] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      (this->q_8).m_data[1] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      (this->q_8).m_data[2] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      (this->q_8).m_data[3] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dt.rot);
  Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dt.rot,
         &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_240,&local_260);
  Qcross((ChQuaternion<double> *)local_118,(ChQuaternion<double> *)&local_1b8);
  local_1d8.m_data[0] =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_1d8.m_data[1] =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_1d8.m_data[2] =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_1d8.m_data[3] =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  Qscale((ChQuaternion<double> *)&local_2a8,&local_1d8,2.0);
  pCVar85 = &this->q_8;
  local_1d8.m_data[0] =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_1d8.m_data[1] =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_1d8.m_data[2] =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_1d8.m_data[3] =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  Qadd(pCVar85,&local_1d8);
  if (&local_2a8 != (ChMatrix33<double> *)pCVar85) {
    pCVar85->m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->q_8).m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->q_8).m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->q_8).m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  pCVar75 = this->marker1;
  pCVar84 = &(pCVar75->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar84 != &local_1f8) {
    local_1f8.m_data[0] = pCVar84->m_data[0];
    local_1f8.m_data[1] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_1f8.m_data[2] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_1f8.m_data[3] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar83 = Qnotnull(&local_1f8);
  local_220 = pCVar85;
  if (bVar83) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
    pCVar85 = local_220;
    Qcross(&local_240,&local_260);
    Qcross((ChQuaternion<double> *)local_118,(ChQuaternion<double> *)&local_1b8);
    local_1d8.m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1d8.m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_2a8,&local_1d8,2.0);
    local_1d8.m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1d8.m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(pCVar85,&local_1d8);
    if (&local_2a8 != (ChMatrix33<double> *)pCVar85) {
      pCVar85->m_data[0] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      pCVar85->m_data[1] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      pCVar85->m_data[2] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      pCVar85->m_data[3] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  pCVar75 = this->marker1;
  pCVar84 = &(pCVar75->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar84 != &local_1f8) {
    local_1f8.m_data[0] = pCVar84->m_data[0];
    local_1f8.m_data[1] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_1f8.m_data[2] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_1f8.m_data[3] = (pCVar75->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar83 = Qnotnull(&local_1f8);
  if (bVar83) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dt.rot,
           &(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&local_240,&local_260);
    Qcross((ChQuaternion<double> *)local_118,(ChQuaternion<double> *)&local_1b8);
    local_1d8.m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1d8.m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_2a8,&local_1d8,2.0);
    local_1d8.m_data[0] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1d8.m_data[1] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1d8.m_data[2] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1d8.m_data[3] =
         local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(pCVar85,&local_1d8);
    if (&local_2a8 != (ChMatrix33<double> *)pCVar85) {
      pCVar85->m_data[0] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      pCVar85->m_data[1] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      pCVar85->m_data[2] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      pCVar85->m_data[3] =
           local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  ChFrameMoving<double>::Compute_Adt(&this->marker2->super_ChFrameMoving<double>,&local_2a8);
  ChFrameMoving<double>::Compute_Adtdt
            (&this->marker2->super_ChFrameMoving<double>,(ChMatrix33<double> *)local_118);
  ChFrameMoving<double>::Compute_Adt
            (&((this->super_ChLink).Body2)->super_ChFrameMoving<double>,&local_1b8);
  auVar127._0_8_ = (this->PQw).m_data[1];
  auVar89._8_8_ = 0;
  auVar89._0_8_ = (this->PQw).m_data[0];
  auVar132._8_8_ = 0;
  auVar132._0_8_ = (this->PQw).m_data[2];
  auVar79._8_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar79._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar176._8_8_ = 0;
  auVar176._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar81._8_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar81._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar201._8_8_ = 0;
  auVar201._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar108._8_8_ = 0;
  auVar108._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar175 = vfmadd231sd_fma(auVar108,auVar89,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar147._8_8_ = 0;
  auVar147._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar86 = vfmadd231sd_fma(auVar147,auVar89,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar162._8_8_ = 0;
  auVar162._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar131 = vfmadd231sd_fma(auVar162,auVar89,auVar3);
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar175 = vfmadd231sd_fma(auVar175,auVar132,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar86 = vfmadd231sd_fma(auVar86,auVar132,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar131 = vfmadd231sd_fma(auVar131,auVar132,auVar6);
  auVar127._0_8_ = auVar175._0_8_;
  auVar109._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       auVar127._0_8_;
  auVar109._8_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       auVar127._0_8_;
  auVar181._8_8_ = 0;
  auVar181._0_8_ =
       auVar127._0_8_ *
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar87 = vfmadd231sd_fma(auVar181,auVar90,auVar131);
  auVar163._0_8_ = auVar131._0_8_;
  auVar163._8_8_ = auVar163._0_8_;
  auVar175 = vfmadd213pd_fma(auVar163,auVar79,auVar109);
  auVar110._8_8_ = auVar86._0_8_;
  auVar110._0_8_ = auVar86._0_8_;
  auVar86 = vfmadd231sd_fma(auVar87,auVar176,auVar86);
  auVar175 = vfmadd213pd_fma(auVar110,auVar81,auVar175);
  auVar164._8_8_ = 0;
  auVar164._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar103._0_8_ = auVar86._0_8_ + auVar86._0_8_;
  auVar111._0_8_ = auVar175._0_8_ + auVar175._0_8_;
  auVar111._8_8_ = auVar175._8_8_ + auVar175._8_8_;
  *(undefined1 (*) [16])(this->q_4).m_data = auVar111;
  (this->q_4).m_data[2] = auVar103._0_8_;
  pCVar77 = &((this->super_ChLink).Body2)->super_ChFrameMoving<double>;
  auVar127._0_8_ = (this->PQw_dt).m_data[1];
  auVar203._8_8_ = 0;
  auVar203._0_8_ = (this->PQw_dt).m_data[0];
  auVar205._8_8_ = 0;
  auVar205._0_8_ = (this->PQw_dt).m_data[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)(pCVar77->super_ChFrame<double>).Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 8);
  auVar204._8_8_ = 0;
  auVar204._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x20);
  auVar175 = vfmadd231sd_fma(auVar204,auVar203,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar207._8_8_ = 0;
  auVar207._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x18);
  auVar86 = vfmadd231sd_fma(auVar207,auVar203,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)(pCVar77->super_ChFrame<double>).Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x10);
  auVar206._8_8_ = 0;
  auVar206._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x28);
  auVar131 = vfmadd231sd_fma(auVar206,auVar203,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x38);
  auVar175 = vfmadd231sd_fma(auVar175,auVar205,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar86 = vfmadd231sd_fma(auVar86,auVar205,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar131 = vfmadd231sd_fma(auVar131,auVar205,auVar12);
  auVar127._0_8_ = auVar175._0_8_;
  auVar133._8_8_ = 0;
  auVar133._0_8_ =
       auVar127._0_8_ *
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar175 = vfmadd231sd_fma(auVar133,auVar86,auVar90);
  auVar87 = vfmadd231sd_fma(auVar175,auVar131,auVar176);
  auVar175 = vshufpd_avx(auVar111,auVar111,1);
  auVar134._8_8_ = 0;
  auVar134._0_8_ =
       auVar127._0_8_ *
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar88 = vfmadd231sd_fma(auVar134,auVar86,auVar164);
  auVar88 = vfmadd231sd_fma(auVar88,auVar131,auVar201);
  auVar148._8_8_ = 0;
  auVar148._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       auVar127._0_8_;
  auVar86 = vfmadd231sd_fma(auVar148,auVar79,auVar86);
  auVar86 = vfmadd231sd_fma(auVar86,auVar81,auVar131);
  (this->q_4).m_data[0] = auVar111._0_8_ + auVar86._0_8_ + auVar86._0_8_;
  (this->q_4).m_data[1] = auVar175._0_8_ + auVar88._0_8_ + auVar88._0_8_;
  (this->q_4).m_data[2] = auVar103._0_8_ + auVar87._0_8_ + auVar87._0_8_;
  ChFrameMoving<double>::Compute_Adt(pCVar77,&local_1b8);
  auVar127._0_8_ = (this->PQw_dt).m_data[1];
  auVar91._8_8_ = 0;
  auVar91._0_8_ = (this->PQw_dt).m_data[0];
  auVar135._8_8_ = 0;
  auVar135._0_8_ = (this->PQw_dt).m_data[2];
  pCVar75 = this->marker2;
  pCVar78 = (this->super_ChLink).Body2;
  auVar103._0_8_ = (this->PQw).m_data[1];
  auVar182._8_8_ = 0;
  auVar182._0_8_ = (this->PQw).m_data[2];
  auVar187._8_8_ = 0;
  auVar187._0_8_ = local_118._16_8_;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = local_d8;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar112._8_8_ = 0;
  auVar112._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar175 = vfmadd231sd_fma(auVar112,auVar91,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar165._8_8_ = 0;
  auVar165._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar86 = vfmadd231sd_fma(auVar165,auVar91,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar149._8_8_ = 0;
  auVar149._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar131 = vfmadd231sd_fma(auVar149,auVar91,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar175 = vfmadd231sd_fma(auVar175,auVar135,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar86 = vfmadd231sd_fma(auVar86,auVar135,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar131 = vfmadd231sd_fma(auVar131,auVar135,auVar18);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = (this->PQw).m_data[0];
  auVar127._0_8_ = auVar175._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar175 = vfmadd231sd_fma(auVar92,auVar86,auVar19);
  auVar113._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar113._8_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar166._0_8_ = auVar86._0_8_;
  auVar166._8_8_ = auVar166._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar86 = vfmadd231sd_fma(auVar175,auVar131,auVar20);
  auVar175 = vfmadd132pd_fma(auVar166,auVar113,
                             *(undefined1 (*) [16])
                              (pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
  auVar114._8_8_ = auVar131._0_8_;
  auVar114._0_8_ = auVar131._0_8_;
  auVar175 = vfmadd132pd_fma(auVar114,auVar175,
                             *(undefined1 (*) [16])
                              ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.
                                      Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data + 0x30));
  auVar127._0_8_ = auVar86._0_8_ + auVar86._0_8_ + (this->q_4).m_data[2];
  dVar106 = auVar175._0_8_ + auVar175._0_8_ + (this->q_4).m_data[0];
  dVar130 = auVar175._8_8_ + auVar175._8_8_ + (this->q_4).m_data[1];
  (this->q_4).m_data[0] = dVar106;
  (this->q_4).m_data[1] = dVar130;
  (this->q_4).m_data[2] = auVar127._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar202._8_8_ = 0;
  auVar202._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar175 = vfmadd231sd_fma(auVar202,auVar136,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar167._8_8_ = 0;
  auVar167._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar86 = vfmadd231sd_fma(auVar167,auVar136,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar131 = vfmadd231sd_fma(auVar150,auVar136,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar175 = vfmadd231sd_fma(auVar175,auVar182,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar86 = vfmadd231sd_fma(auVar86,auVar182,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar131 = vfmadd231sd_fma(auVar131,auVar182,auVar26);
  dVar200 = auVar175._0_8_;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = dVar200 * (double)local_118._40_8_;
  auVar87 = vfmadd231sd_fma(auVar192,auVar86,auVar187);
  auVar188._0_8_ = dVar200 * (double)local_118._24_8_;
  auVar188._8_8_ = dVar200 * (double)local_118._32_8_;
  auVar168._0_8_ = auVar86._0_8_;
  auVar168._8_8_ = auVar168._0_8_;
  auVar175 = vfmadd132pd_fma(auVar168,auVar188,local_118._0_16_);
  auVar86 = vfmadd231sd_fma(auVar87,auVar131,auVar197);
  auVar151._0_8_ = auVar131._0_8_;
  auVar151._8_8_ = auVar151._0_8_;
  auVar175 = vfmadd132pd_fma(auVar151,auVar175,local_118._48_16_);
  (this->q_4).m_data[0] = auVar175._0_8_ + dVar106;
  (this->q_4).m_data[1] = auVar175._8_8_ + dVar130;
  (this->q_4).m_data[2] = auVar86._0_8_ + auVar127._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar152._8_8_ = 0;
  auVar152._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar175 = vfmadd231sd_fma(auVar152,auVar136,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar115._8_8_ = 0;
  auVar115._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar86 = vfmadd231sd_fma(auVar115,auVar136,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar131 = vfmadd231sd_fma(auVar93,auVar136,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar175 = vfmadd231sd_fma(auVar175,auVar182,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar86 = vfmadd231sd_fma(auVar86,auVar182,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar131 = vfmadd231sd_fma(auVar131,auVar182,auVar32);
  auVar127._0_8_ = auVar175._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar137._8_8_ = 0;
  auVar137._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar175 = vfmadd231sd_fma(auVar137,auVar86,auVar33);
  auVar153._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar153._8_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar116._0_8_ = auVar86._0_8_;
  auVar116._8_8_ = auVar116._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar86 = vfmadd231sd_fma(auVar175,auVar131,auVar34);
  auVar94._0_8_ = auVar131._0_8_;
  auVar94._8_8_ = auVar94._0_8_;
  auVar175 = vfmadd132pd_fma(auVar116,auVar153,
                             *(undefined1 (*) [16])
                              (pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
  auVar175 = vfmadd132pd_fma(auVar94,auVar175,
                             *(undefined1 (*) [16])
                              ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.
                                      Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data + 0x30));
  *(undefined1 (*) [16])(this->relM).pos.m_data = auVar175;
  (this->relM).pos.m_data[2] = auVar86._0_8_;
  Qconjugate(&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
              super_ChFrame<double>.coord.rot);
  Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>
          .coord.rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_138,&local_158);
  Qcross(&local_240,&local_260);
  local_168 = &(this->relM).rot;
  if (&local_1b8 != (ChMatrix33<double> *)local_168) {
    local_168->m_data[0] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->relM).rot.m_data[1] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->relM).rot.m_data[2] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->relM).rot.m_data[3] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  pCVar77 = &((this->super_ChLink).Body2)->super_ChFrameMoving<double>;
  auVar127._0_8_ = (this->PQw).m_data[1];
  auVar95._8_8_ = 0;
  auVar95._0_8_ = (this->PQw).m_data[0];
  auVar138._8_8_ = 0;
  auVar138._0_8_ = (this->PQw).m_data[2];
  pCVar75 = this->marker2;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        8);
  auVar117._8_8_ = 0;
  auVar117._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x20);
  auVar175 = vfmadd231sd_fma(auVar117,auVar95,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar169._8_8_ = 0;
  auVar169._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x18);
  auVar86 = vfmadd231sd_fma(auVar169,auVar95,auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x10);
  auVar154._8_8_ = 0;
  auVar154._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x28);
  auVar131 = vfmadd231sd_fma(auVar154,auVar95,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x38);
  auVar175 = vfmadd231sd_fma(auVar175,auVar138,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar86 = vfmadd231sd_fma(auVar86,auVar138,auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       *(double *)
        ((long)(pCVar77->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar131 = vfmadd231sd_fma(auVar131,auVar138,auVar40);
  auVar127._0_8_ = auVar175._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       auVar127._0_8_ *
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar175 = vfmadd231sd_fma(auVar96,auVar86,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar175 = vfmadd231sd_fma(auVar175,auVar131,auVar42);
  local_170 = auVar175._0_8_;
  auVar97._0_8_ =
       auVar127._0_8_ *
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar97._8_8_ =
       auVar127._0_8_ *
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar118._8_8_ = auVar86._0_8_;
  auVar118._0_8_ = auVar86._0_8_;
  auVar80._8_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar80._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar175 = vfmadd132pd_fma(auVar118,auVar97,auVar80);
  auVar98._8_8_ = auVar131._0_8_;
  auVar98._0_8_ = auVar131._0_8_;
  auVar82._8_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar82._0_8_ =
       local_2a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_c8._0_16_ = vfmadd132pd_fma(auVar98,auVar175,auVar82);
  ChFrameMoving<double>::Compute_Adt(pCVar77,&local_1b8);
  pCVar78 = (this->super_ChLink).Body2;
  auVar127._0_8_ = (this->PQw).m_data[1];
  auVar103._0_8_ = (this->PQw_dt).m_data[1];
  auVar119._8_8_ = 0;
  auVar119._0_8_ = (this->PQw).m_data[0];
  auVar177._8_8_ = 0;
  auVar177._0_8_ = (this->PQw_dt).m_data[0];
  auVar99._8_8_ = 0;
  auVar99._0_8_ = (this->PQw).m_data[2];
  pCVar76 = this->marker2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar139._8_8_ = 0;
  auVar139._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar175 = vfmadd231sd_fma(auVar139,auVar119,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar170._8_8_ = 0;
  auVar170._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar86 = vfmadd231sd_fma(auVar170,auVar119,auVar44);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar155._8_8_ = 0;
  auVar155._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar131 = vfmadd231sd_fma(auVar155,auVar119,auVar45);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = (this->PQw_dt).m_data[2];
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar183._8_8_ = 0;
  auVar183._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar87 = vfmadd231sd_fma(auVar183,auVar177,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar175 = vfmadd231sd_fma(auVar175,auVar99,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar193._8_8_ = 0;
  auVar193._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar88 = vfmadd231sd_fma(auVar193,auVar177,auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar189._8_8_ = 0;
  auVar189._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar103 = vfmadd231sd_fma(auVar189,auVar177,auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar86 = vfmadd231sd_fma(auVar86,auVar99,auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar131 = vfmadd231sd_fma(auVar131,auVar99,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar87 = vfmadd231sd_fma(auVar87,auVar120,auVar52);
  auVar127._0_8_ = auVar175._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar88 = vfmadd231sd_fma(auVar88,auVar120,auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar107 = vfmadd231sd_fma(auVar103,auVar120,auVar54);
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar175 = vfmadd231sd_fma(auVar100,auVar86,auVar55);
  auVar103._0_8_ = auVar87._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       *(double *)
        ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar121._8_8_ = 0;
  auVar121._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar87 = vfmadd231sd_fma(auVar121,auVar88,auVar56);
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar1 = vfmadd231sd_fma(auVar175,auVar131,auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       *(double *)
        ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar87 = vfmadd231sd_fma(auVar87,auVar107,auVar58);
  auVar122._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar122._8_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar140._8_8_ = auVar86._0_8_;
  auVar140._0_8_ = auVar86._0_8_;
  auVar175 = vfmadd132pd_fma(auVar140,auVar122,
                             *(undefined1 (*) [16])
                              (pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
  auVar123._8_8_ = auVar131._0_8_;
  auVar123._0_8_ = auVar131._0_8_;
  auVar156._8_8_ = auVar88._0_8_;
  auVar156._0_8_ = auVar88._0_8_;
  auVar175 = vfmadd132pd_fma(auVar123,auVar175,
                             *(undefined1 (*) [16])
                              ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.
                                      Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data + 0x30));
  auVar141._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar141._8_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar86 = vfmadd132pd_fma(auVar156,auVar141,
                            *(undefined1 (*) [16])
                             (pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar142._8_8_ = auVar107._0_8_;
  auVar142._0_8_ = auVar107._0_8_;
  auVar86 = vfmadd132pd_fma(auVar142,auVar86,
                            *(undefined1 (*) [16])
                             ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.
                                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data + 0x30));
  (this->relM_dt).pos.m_data[0] = auVar175._0_8_ + (double)local_c8._0_8_ + auVar86._0_8_;
  (this->relM_dt).pos.m_data[1] = auVar175._8_8_ + (double)local_c8._8_8_ + auVar86._8_8_;
  (this->relM_dt).pos.m_data[2] = auVar1._0_8_ + local_170 + auVar87._0_8_;
  Qadd(&this->q_AD,local_160);
  pCVar85 = &(this->relM_dt).rot;
  if (&local_1b8 != (ChMatrix33<double> *)pCVar85) {
    pCVar85->m_data[0] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->relM_dt).rot.m_data[1] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->relM_dt).rot.m_data[2] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->relM_dt).rot.m_data[3] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  pCVar75 = this->marker2;
  ChFrameMoving<double>::Compute_Adtdt
            (&((this->super_ChLink).Body2)->super_ChFrameMoving<double>,&local_1b8);
  auVar127._0_8_ = (this->PQw).m_data[1];
  auVar101._8_8_ = 0;
  auVar101._0_8_ = (this->PQw).m_data[0];
  pCVar78 = (this->super_ChLink).Body2;
  auVar103._0_8_ = (this->PQw_dtdt).m_data[1];
  auVar143._8_8_ = 0;
  auVar143._0_8_ = (this->PQw).m_data[2];
  auVar157._8_8_ = 0;
  auVar157._0_8_ = (this->PQw_dtdt).m_data[0];
  pCVar76 = this->marker2;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = (this->PQw_dtdt).m_data[2];
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar184._8_8_ = 0;
  auVar184._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar175 = vfmadd231sd_fma(auVar184,auVar101,auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar190._8_8_ = 0;
  auVar190._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar86 = vfmadd231sd_fma(auVar190,auVar101,auVar60);
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar124._8_8_ = 0;
  auVar124._0_8_ =
       auVar127._0_8_ *
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar131 = vfmadd231sd_fma(auVar124,auVar101,auVar61);
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar131 = vfmadd231sd_fma(auVar131,auVar143,auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar87 = vfmadd231sd_fma(auVar175,auVar143,auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar175 = vfmadd231sd_fma(auVar86,auVar143,auVar64);
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       (pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar194._8_8_ = 0;
  auVar194._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar86 = vfmadd231sd_fma(auVar194,auVar157,auVar65);
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar171._8_8_ = 0;
  auVar171._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar88 = vfmadd231sd_fma(auVar171,auVar157,auVar66);
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar144._8_8_ = 0;
  auVar144._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar103 = vfmadd231sd_fma(auVar144,auVar157,auVar67);
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar86 = vfmadd231sd_fma(auVar86,auVar178,auVar68);
  auVar127._0_8_ = auVar131._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar131 = vfmadd231sd_fma(auVar88,auVar178,auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar102._8_8_ = 0;
  auVar102._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar88 = vfmadd231sd_fma(auVar102,auVar175,auVar70);
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       *(double *)
        ((long)&(pCVar78->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar107 = vfmadd231sd_fma(auVar103,auVar178,auVar71);
  auVar103._0_8_ = auVar131._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar131 = vfmadd231sd_fma(auVar88,auVar87,auVar72);
  auVar125._0_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar125._8_8_ =
       auVar127._0_8_ *
       *(double *)
        ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       *(double *)
        ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar158._8_8_ = 0;
  auVar158._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar88 = vfmadd231sd_fma(auVar158,auVar86,auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       *(double *)
        ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar88 = vfmadd231sd_fma(auVar88,auVar107,auVar74);
  auVar145._0_8_ = auVar107._0_8_;
  auVar145._8_8_ = auVar145._0_8_;
  auVar159._8_8_ = auVar175._0_8_;
  auVar159._0_8_ = auVar175._0_8_;
  auVar175 = vfmadd132pd_fma(auVar159,auVar125,
                             *(undefined1 (*) [16])
                              (pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
  auVar126._8_8_ = auVar87._0_8_;
  auVar126._0_8_ = auVar87._0_8_;
  auVar127._0_8_ = (this->q_4).m_data[2];
  auVar175 = vfmadd132pd_fma(auVar126,auVar175,
                             *(undefined1 (*) [16])
                              ((long)&(pCVar75->super_ChFrameMoving<double>).super_ChFrame<double>.
                                      Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                      m_storage.m_data + 0x30));
  auVar160._0_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar160._8_8_ =
       auVar103._0_8_ *
       *(double *)
        ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar172._8_8_ = auVar86._0_8_;
  auVar172._0_8_ = auVar86._0_8_;
  auVar86 = vfmadd132pd_fma(auVar172,auVar160,
                            *(undefined1 (*) [16])
                             (pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar86 = vfmadd132pd_fma(auVar145,auVar86,
                            *(undefined1 (*) [16])
                             ((long)&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.
                                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data + 0x30));
  auVar103._0_8_ = (this->q_4).m_data[1];
  (this->relM_dtdt).pos.m_data[0] = auVar175._0_8_ + auVar86._0_8_ + (this->q_4).m_data[0];
  (this->relM_dtdt).pos.m_data[1] = auVar175._8_8_ + auVar86._8_8_ + auVar103._0_8_;
  (this->relM_dtdt).pos.m_data[2] = auVar131._0_8_ + auVar88._0_8_ + auVar127._0_8_;
  Qconjugate(&(pCVar76->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dtdt.rot);
  Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
          rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_138,&local_158);
  Qcross(&local_240,&local_260);
  local_1d8.m_data[0] =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_1d8.m_data[1] =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_1d8.m_data[2] =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_1d8.m_data[3] =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  Qadd(local_220,&local_1d8);
  pCVar85 = &(this->relM_dtdt).rot;
  if (&local_1b8 != (ChMatrix33<double> *)pCVar85) {
    pCVar85->m_data[0] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->relM_dtdt).rot.m_data[1] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->relM_dtdt).rot.m_data[2] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->relM_dtdt).rot.m_data[3] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
              coord.rot);
  Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dtdt.rot,
         &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_138,&local_158);
  Qcross(&local_240,&local_260);
  local_1d8.m_data[0] =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_1d8.m_data[1] =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_1d8.m_data[2] =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_1d8.m_data[3] =
       local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  Qadd(pCVar85,&local_1d8);
  if (&local_1b8 != (ChMatrix33<double> *)pCVar85) {
    pCVar85->m_data[0] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->relM_dtdt).rot.m_data[1] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->relM_dtdt).rot.m_data[2] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->relM_dtdt).rot.m_data[3] =
         local_1b8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  Q_to_AngAxis(local_168,&this->relAngle,&this->relAxis);
  auVar127._0_8_ = (this->relAxis).m_data[2];
  auVar103._0_8_ = this->relAngle;
  if (0.0 <= auVar127._0_8_) {
    dVar106 = (this->relAxis).m_data[0];
    dVar130 = (this->relAxis).m_data[1];
  }
  else {
    dVar106 = -(this->relAxis).m_data[0];
    dVar130 = -(this->relAxis).m_data[1];
    auVar127._0_8_ = -auVar127._0_8_;
    auVar127._8_8_ = 0x8000000000000000;
    auVar103._0_8_ = -auVar103._0_8_;
    auVar103._8_8_ = 0x8000000000000000;
    (this->relAxis).m_data[0] = dVar106;
    (this->relAxis).m_data[1] = dVar130;
    dVar200 = (double)vmovlpd_avx(auVar127);
    (this->relAxis).m_data[2] = dVar200;
    dVar200 = (double)vmovlpd_avx(auVar103);
    this->relAngle = dVar200;
  }
  (this->relRotaxis).m_data[0] = auVar103._0_8_ * dVar106;
  (this->relRotaxis).m_data[1] = auVar103._0_8_ * dVar130;
  (this->relRotaxis).m_data[2] = auVar103._0_8_ * auVar127._0_8_;
  auVar127._0_8_ = (this->relM).rot.m_data[0];
  auVar103._0_8_ = (this->relM).rot.m_data[2];
  dVar106 = (this->relM).rot.m_data[3];
  dVar130 = (this->relM).rot.m_data[1];
  dVar200 = (this->relM_dt).rot.m_data[1];
  auVar185._8_8_ = 0;
  auVar185._0_8_ = (this->relM_dt).rot.m_data[0];
  auVar179._8_8_ = 0;
  auVar179._0_8_ = (this->relM_dt).rot.m_data[2];
  auVar173._8_8_ = 0;
  auVar173._0_8_ = (this->relM_dt).rot.m_data[3];
  auVar103._0_8_ = auVar103._0_8_ + auVar103._0_8_;
  dVar106 = dVar106 + dVar106;
  auVar127._0_8_ = auVar127._0_8_ + auVar127._0_8_;
  dVar130 = dVar130 + dVar130;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar106;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = dVar200 * auVar103._0_8_;
  auVar175 = vfnmsub231sd_fma(auVar195,auVar161,auVar185);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = auVar103._0_8_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = dVar106 * dVar200;
  auVar86 = vfnmadd231sd_fma(auVar198,auVar146,auVar185);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = dVar130;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = auVar127._0_8_ * dVar200;
  auVar131 = vfnmadd231sd_fma(auVar191,auVar128,auVar185);
  auVar175 = vfmadd231sd_fma(auVar175,auVar128,auVar179);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = auVar127._0_8_;
  auVar86 = vfmadd231sd_fma(auVar86,auVar104,auVar179);
  auVar131 = vfnmadd231sd_fma(auVar131,auVar161,auVar179);
  auVar131 = vfmadd231sd_fma(auVar131,auVar146,auVar173);
  auVar175 = vfmadd231sd_fma(auVar175,auVar104,auVar173);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = dVar130;
  auVar86 = vfnmadd231sd_fma(auVar86,auVar129,auVar173);
  (this->relWvel).m_data[0] = auVar131._0_8_;
  (this->relWvel).m_data[1] = auVar86._0_8_;
  (this->relWvel).m_data[2] = auVar175._0_8_;
  dVar130 = (this->relM_dtdt).rot.m_data[1];
  auVar186._8_8_ = 0;
  auVar186._0_8_ = (this->relM_dtdt).rot.m_data[0];
  auVar180._8_8_ = 0;
  auVar180._0_8_ = (this->relM_dtdt).rot.m_data[2];
  auVar174._8_8_ = 0;
  auVar174._0_8_ = (this->relM_dtdt).rot.m_data[3];
  auVar196._8_8_ = 0;
  auVar196._0_8_ = dVar130 * auVar103._0_8_;
  auVar175 = vfnmsub231sd_fma(auVar196,auVar161,auVar186);
  auVar199._8_8_ = 0;
  auVar199._0_8_ = dVar106 * dVar130;
  auVar86 = vfnmadd231sd_fma(auVar199,auVar146,auVar186);
  auVar175 = vfmadd231sd_fma(auVar175,auVar129,auVar180);
  auVar86 = vfmadd231sd_fma(auVar86,auVar104,auVar180);
  auVar175 = vfmadd231sd_fma(auVar175,auVar104,auVar174);
  auVar131 = vfnmadd231sd_fma(auVar86,auVar129,auVar174);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = auVar127._0_8_ * dVar130;
  auVar86 = vfnmadd231sd_fma(auVar105,auVar129,auVar186);
  auVar86 = vfnmadd231sd_fma(auVar86,auVar161,auVar180);
  auVar86 = vfmadd231sd_fma(auVar86,auVar146,auVar174);
  (this->relWacc).m_data[0] = auVar86._0_8_;
  (this->relWacc).m_data[1] = auVar131._0_8_;
  (this->relWacc).m_data[2] = auVar175._0_8_;
  return;
}

Assistant:

void ChLinkMarkers::UpdateRelMarkerCoords() {
    PQw = Vsub(marker1->GetAbsCoord().pos, marker2->GetAbsCoord().pos);
    PQw_dt = Vsub(marker1->GetAbsCoord_dt().pos, marker2->GetAbsCoord_dt().pos);
    PQw_dtdt = Vsub(marker1->GetAbsCoord_dtdt().pos, marker2->GetAbsCoord_dtdt().pos);

    dist = Vlength(PQw);                 // distance between origins, modulus
    dist_dt = Vdot(Vnorm(PQw), PQw_dt);  // speed between origins, modulus.

    Quaternion qtemp1;

    Quaternion temp1 = marker1->GetCoord_dt().rot;
    Quaternion temp2 = marker2->GetCoord_dt().rot;

    if (Qnotnull(temp1) || Qnotnull(temp2)) {
        q_AD =  //  q'qqq + qqqq'
            Qadd(Qcross(Qconjugate(marker2->GetCoord_dt().rot),
                        Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                               Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord().rot)))),
                 Qcross(Qconjugate(marker2->GetCoord().rot),
                        Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                               Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord_dt().rot)))));
    } else
        q_AD = QNULL;

    q_BC =  // qq'qq + qqq'q
        Qadd(Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(marker2->GetBody()->GetCoord_dt().rot),
                           Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord().rot)))),
             Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                           Qcross((marker1->GetBody()->GetCoord_dt().rot), (marker1->GetCoord().rot)))));

    // q_8 = q''qqq + 2q'q'qq + 2q'qq'q + 2q'qqq'
    //     + 2qq'q'q + 2qq'qq' + 2qqq'q' + qqqq''
    temp2 = marker2->GetCoord_dtdt().rot;
    if (Qnotnull(temp2))
        q_8 = Qcross(Qconjugate(marker2->GetCoord_dtdt().rot),
                     Qcross(Qconjugate(Body2->GetCoord().rot),
                            Qcross(Body1->GetCoord().rot,
                                   marker1->GetCoord().rot)));  // q_dtdt'm2 * q'o2 * q,o1 * q,m1
    else
        q_8 = QNULL;
    temp1 = marker1->GetCoord_dtdt().rot;
    if (Qnotnull(temp1)) {
        qtemp1 = Qcross(Qconjugate(marker2->GetCoord().rot),
                        Qcross(Qconjugate(Body2->GetCoord().rot),
                               Qcross(Body1->GetCoord().rot,
                                      marker1->GetCoord_dtdt().rot)));  // q'm2 * q'o2 * q,o1 * q_dtdt,m1
        q_8 = Qadd(q_8, qtemp1);
    }
    temp2 = marker2->GetCoord_dt().rot;
    if (Qnotnull(temp2)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord_dt().rot),
            Qcross(Qconjugate(Body2->GetCoord_dt().rot), Qcross(Body1->GetCoord().rot, marker1->GetCoord().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q_dt'm2 * q_dt'o2 * q,o1 * q,m1)
        q_8 = Qadd(q_8, qtemp1);
    }
    temp2 = marker2->GetCoord_dt().rot;
    if (Qnotnull(temp2)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord_dt().rot),
            Qcross(Qconjugate(Body2->GetCoord().rot), Qcross(Body1->GetCoord_dt().rot, marker1->GetCoord().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q_dt'm2 * q'o2 * q_dt,o1 * q,m1)
        q_8 = Qadd(q_8, qtemp1);
    }
    temp1 = marker1->GetCoord_dt().rot;
    temp2 = marker2->GetCoord_dt().rot;
    if (Qnotnull(temp2) && Qnotnull(temp1)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord_dt().rot),
            Qcross(Qconjugate(Body2->GetCoord().rot), Qcross(Body1->GetCoord().rot, marker1->GetCoord_dt().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q_dt'm2 * q'o2 * q,o1 * q_dt,m1)
        q_8 = Qadd(q_8, qtemp1);
    }

    qtemp1 =
        Qcross(Qconjugate(marker2->GetCoord().rot),
               Qcross(Qconjugate(Body2->GetCoord_dt().rot), Qcross(Body1->GetCoord_dt().rot, marker1->GetCoord().rot)));
    qtemp1 = Qscale(qtemp1, 2);  // 2( q'm2 * q_dt'o2 * q_dt,o1 * q,m1)
    q_8 = Qadd(q_8, qtemp1);
    temp1 = marker1->GetCoord_dt().rot;
    if (Qnotnull(temp1)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord().rot),
            Qcross(Qconjugate(Body2->GetCoord_dt().rot), Qcross(Body1->GetCoord().rot, marker1->GetCoord_dt().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q'm2 * q_dt'o2 * q,o1 * q_dt,m1)
        q_8 = Qadd(q_8, qtemp1);
    }
    temp1 = marker1->GetCoord_dt().rot;
    if (Qnotnull(temp1)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord().rot),
            Qcross(Qconjugate(Body2->GetCoord().rot), Qcross(Body1->GetCoord_dt().rot, marker1->GetCoord_dt().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q'm2 * q'o2 * q_dt,o1 * q_dt,m1)
        q_8 = Qadd(q_8, qtemp1);
    }

    // q_4 = [Adtdt]'[A]'q + 2[Adt]'[Adt]'q
    //       + 2[Adt]'[A]'qdt + 2[A]'[Adt]'qdt
    ChMatrix33<> m2_Rel_A_dt;
    marker2->Compute_Adt(m2_Rel_A_dt);
    ChMatrix33<> m2_Rel_A_dtdt;
    marker2->Compute_Adtdt(m2_Rel_A_dtdt);

    ChVector<> vtemp1;
    ChVector<> vtemp2;

    vtemp1 = Body2->GetA_dt().transpose() * PQw;
    vtemp2 = m2_Rel_A_dt.transpose() * vtemp1;
    q_4 = Vmul(vtemp2, 2);  // 2[Aq_dt]'[Ao2_dt]'*Qpq,w

    vtemp1 = Body2->GetA().transpose() * PQw_dt;
    vtemp2 = m2_Rel_A_dt.transpose() * vtemp1;
    vtemp2 = Vmul(vtemp2, 2);  // 2[Aq_dt]'[Ao2]'*Qpq,w_dt
    q_4 = Vadd(q_4, vtemp2);

    vtemp1 = Body2->GetA_dt().transpose() * PQw_dt;
    vtemp2 = marker2->GetA().transpose() * vtemp1;
    vtemp2 = Vmul(vtemp2, 2);  // 2[Aq]'[Ao2_dt]'*Qpq,w_dt
    q_4 = Vadd(q_4, vtemp2);

    vtemp1 = Body2->GetA().transpose() * PQw;
    vtemp2 = m2_Rel_A_dtdt.transpose() * vtemp1;
    q_4 = Vadd(q_4, vtemp2);  //  [Aq_dtdt]'[Ao2]'*Qpq,w

    // ----------- RELATIVE MARKER COORDINATES

    // relM.pos
    relM.pos = marker2->GetA().transpose() * (Body2->GetA().transpose() * PQw);

    // relM.rot
    relM.rot = Qcross(Qconjugate(marker2->GetCoord().rot),
                      Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                             Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord().rot))));

    // relM_dt.pos
    relM_dt.pos = m2_Rel_A_dt.transpose() * (Body2->GetA().transpose() * PQw) +
                  marker2->GetA().transpose() * (Body2->GetA_dt().transpose() * PQw) +
                  marker2->GetA().transpose() * (Body2->GetA().transpose() * PQw_dt);

    // relM_dt.rot
    relM_dt.rot = Qadd(q_AD, q_BC);

    // relM_dtdt.pos
    relM_dtdt.pos = marker2->GetA().transpose() * (Body2->GetA_dtdt().transpose() * PQw) +
                    marker2->GetA().transpose() * (Body2->GetA().transpose() * PQw_dtdt) + q_4;

    // relM_dtdt.rot
    qtemp1 = Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(Body2->GetCoord_dtdt().rot),
                           Qcross(Body1->GetCoord().rot,
                                  marker1->GetCoord().rot)));  // ( q'm2 * q_dtdt'o2 * q,o1 * q,m1)
    relM_dtdt.rot = Qadd(q_8, qtemp1);
    qtemp1 = Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(Body2->GetCoord().rot),
                           Qcross(Body1->GetCoord_dtdt().rot,
                                  marker1->GetCoord().rot)));  // ( q'm2 * q'o2 * q_dtdt,o1 * q,m1)
    relM_dtdt.rot = Qadd(relM_dtdt.rot, qtemp1);               // = q_8 + qq''qq + qqq''q

    // ... and also "user-friendly" relative coordinates:

    // relAngle and relAxis
    Q_to_AngAxis(relM.rot, relAngle, relAxis);
    // flip rel rotation axis if jerky sign
    if (relAxis.z() < 0) {
        relAxis = Vmul(relAxis, -1);
        relAngle = -relAngle;
    }
    // rotation axis
    relRotaxis = Vmul(relAxis, relAngle);
    // relWvel
    ChGwMatrix34<> relGw(relM.rot);
    relWvel = relGw * relM_dt.rot;
    // relWacc
    relWacc = relGw * relM_dtdt.rot;
}